

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Logger::Impl::Impl(Impl *this,char *fileName,int line)

{
  int v;
  LogStream *pLVar1;
  allocator local_19;
  
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  this->line_ = line;
  std::__cxx11::string::string((string *)&this->basename_,fileName,&local_19);
  formatTime(this);
  pLVar1 = LogStream::operator<<(&this->stream_,"Thread ");
  v = CurrentThread::tid();
  pLVar1 = LogStream::operator<<(pLVar1,v);
  LogStream::operator<<(pLVar1,": ");
  return;
}

Assistant:

Logger::Impl::Impl(const char* fileName, int line)
    : stream_(),
      line_(line),
      basename_(fileName) {
    formatTime();
    stream_ << "Thread " << CurrentThread::tid() << ": ";
}